

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::js_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->gen_node_ == true) {
    __lhs = &this->js_const_type_;
    std::operator+(&local_40,__lhs,"thrift = require(\'thrift\');\n");
    std::operator+(&local_60,&local_40,__lhs);
    std::operator+(__return_storage_ptr__,&local_60,"Thrift = thrift.Thrift;\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    if (this->gen_es6_ == false) {
      std::operator+(&local_60,__lhs,"Q = thrift.Q;\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::operator+(&local_60,__lhs,"Int64 = require(\'node-int64\');\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_60,
                   "if (typeof Int64 === \'undefined\' && typeof require === \'function\') {\n  ",
                   &this->js_const_type_);
    std::operator+(__return_storage_ptr__,&local_60,"Int64 = require(\'node-int64\');\n}\n");
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::js_includes() {
  if (gen_node_) {
    string result = js_const_type_ + "thrift = require('thrift');\n"
        + js_const_type_ + "Thrift = thrift.Thrift;\n";
    if (!gen_es6_) {
      result += js_const_type_ + "Q = thrift.Q;\n";
    }
    result += js_const_type_ + "Int64 = require('node-int64');\n";
    return result;
  }
  string result = "if (typeof Int64 === 'undefined' && typeof require === 'function') {\n  " + js_const_type_ + "Int64 = require('node-int64');\n}\n";
  return result;
}